

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode Curl_multi_pollset_ev
                    (Curl_multi *multi,Curl_easy *data,easy_pollset *ps,easy_pollset *last_ps)

{
  byte bVar1;
  curl_socket_t s_00;
  uint uVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  Curl_sh_entry *entry_00;
  bool bVar6;
  uint local_58;
  _Bool dead;
  uchar oldactions;
  uint uStack_54;
  _Bool stillused;
  uint j_1;
  uint j;
  int comboaction;
  uchar last_action;
  uchar cur_action;
  int rc;
  curl_socket_t s;
  Curl_sh_entry *entry;
  uint i;
  easy_pollset *last_ps_local;
  easy_pollset *ps_local;
  Curl_easy *data_local;
  Curl_multi *multi_local;
  
  ps_local = (easy_pollset *)data;
  data_local = (Curl_easy *)multi;
  for (entry._4_4_ = 0; entry._4_4_ < ps->num; entry._4_4_ = entry._4_4_ + 1) {
    bVar1 = ps->actions[entry._4_4_];
    j._2_1_ = 0;
    s_00 = ps->sockets[entry._4_4_];
    _rc = sh_getentry((Curl_hash *)&(data_local->req).deductheadercount,s_00);
    if (_rc == (Curl_sh_entry *)0x0) {
      _rc = sh_addentry((Curl_hash *)&(data_local->req).deductheadercount,s_00);
      if (_rc == (Curl_sh_entry *)0x0) {
        return CURLM_OUT_OF_MEMORY;
      }
    }
    else {
      for (uStack_54 = 0; uStack_54 < last_ps->num; uStack_54 = uStack_54 + 1) {
        if (s_00 == last_ps->sockets[uStack_54]) {
          j._2_1_ = last_ps->actions[uStack_54];
          break;
        }
      }
    }
    if ((j._2_1_ == 0) || (j._2_1_ == bVar1)) {
      if ((j._2_1_ == 0) &&
         (pvVar5 = Curl_hash_pick(&_rc->transfers,&ps_local,8), pvVar5 == (void *)0x0)) {
        _rc->users = _rc->users + 1;
        if ((bVar1 & 1) != 0) {
          _rc->readers = _rc->readers + 1;
        }
        if ((bVar1 & 2) != 0) {
          _rc->writers = _rc->writers + 1;
        }
        pvVar5 = Curl_hash_add(&_rc->transfers,&ps_local,8,ps_local);
        if (pvVar5 == (void *)0x0) {
          Curl_hash_destroy(&_rc->transfers);
          return CURLM_OUT_OF_MEMORY;
        }
      }
    }
    else {
      if ((j._2_1_ & 1) != 0) {
        _rc->readers = _rc->readers - 1;
      }
      if ((j._2_1_ & 2) != 0) {
        _rc->writers = _rc->writers - 1;
      }
      if ((bVar1 & 1) != 0) {
        _rc->readers = _rc->readers + 1;
      }
      if ((bVar1 & 2) != 0) {
        _rc->writers = _rc->writers + 1;
      }
    }
    uVar2 = 0;
    if (_rc->writers != 0) {
      uVar2 = 2;
    }
    uVar2 = uVar2 | _rc->readers != 0;
    if ((j._2_1_ == 0) || (_rc->action != uVar2)) {
      if ((data_local->msg).extmsg.data.whatever != (void *)0x0) {
        set_in_callback((Curl_multi *)data_local,true);
        iVar3 = (*(code *)(data_local->msg).extmsg.data)
                          (ps_local,s_00,uVar2,*(undefined8 *)(data_local->last_poll).sockets,
                           _rc->socketp);
        set_in_callback((Curl_multi *)data_local,false);
        if (iVar3 == -1) {
          *(byte *)((long)&(data_local->set).ioctl_func + 1) =
               *(byte *)((long)&(data_local->set).ioctl_func + 1) & 0xef | 0x10;
          return CURLM_ABORTED_BY_CALLBACK;
        }
      }
      _rc->action = uVar2;
    }
  }
  entry._4_4_ = 0;
  do {
    if (last_ps->num <= entry._4_4_) {
      return CURLM_OK;
    }
    bVar6 = false;
    iVar3 = last_ps->sockets[entry._4_4_];
    for (local_58 = 0; local_58 < ps->num; local_58 = local_58 + 1) {
      if (iVar3 == ps->sockets[local_58]) {
        bVar6 = true;
        break;
      }
    }
    if ((!bVar6) &&
       (entry_00 = sh_getentry((Curl_hash *)&(data_local->req).deductheadercount,iVar3),
       entry_00 != (Curl_sh_entry *)0x0)) {
      bVar1 = last_ps->actions[entry._4_4_];
      entry_00->users = entry_00->users - 1;
      if ((bVar1 & 2) != 0) {
        entry_00->writers = entry_00->writers - 1;
      }
      if ((bVar1 & 1) != 0) {
        entry_00->readers = entry_00->readers - 1;
      }
      if (entry_00->users == 0) {
        bVar6 = false;
        if ((data_local->msg).extmsg.data.whatever != (void *)0x0) {
          set_in_callback((Curl_multi *)data_local,true);
          iVar4 = (*(code *)(data_local->msg).extmsg.data)
                            (ps_local,iVar3,4,*(undefined8 *)(data_local->last_poll).sockets,
                             entry_00->socketp);
          set_in_callback((Curl_multi *)data_local,false);
          bVar6 = iVar4 == -1;
        }
        sh_delentry(entry_00,(Curl_hash *)&(data_local->req).deductheadercount,iVar3);
        if (bVar6) {
          *(byte *)((long)&(data_local->set).ioctl_func + 1) =
               *(byte *)((long)&(data_local->set).ioctl_func + 1) & 0xef | 0x10;
          return CURLM_ABORTED_BY_CALLBACK;
        }
      }
      else {
        Curl_hash_delete(&entry_00->transfers,&ps_local,8);
      }
    }
    entry._4_4_ = entry._4_4_ + 1;
  } while( true );
}

Assistant:

CURLMcode Curl_multi_pollset_ev(struct Curl_multi *multi,
                                struct Curl_easy *data,
                                struct easy_pollset *ps,
                                struct easy_pollset *last_ps)
{
  unsigned int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int rc;

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; i < ps->num; i++) {
    unsigned char cur_action = ps->actions[i];
    unsigned char last_action = 0;
    int comboaction;

    s = ps->sockets[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);
    if(entry) {
      /* check if new for this transfer */
      unsigned int j;
      for(j = 0; j < last_ps->num; j++) {
        if(s == last_ps->sockets[j]) {
          last_action = last_ps->actions[j];
          break;
        }
      }
    }
    else {
      /* this is a socket we did not have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(last_action && (last_action != cur_action)) {
      /* Socket was used already, but different action now */
      if(last_action & CURL_POLL_IN) {
        DEBUGASSERT(entry->readers);
        entry->readers--;
      }
      if(last_action & CURL_POLL_OUT) {
        DEBUGASSERT(entry->writers);
        entry->writers--;
      }
      if(cur_action & CURL_POLL_IN) {
        entry->readers++;
      }
      if(cur_action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!last_action &&
            !Curl_hash_pick(&entry->transfers, (char *)&data, /* hash key */
                            sizeof(struct Curl_easy *))) {
      DEBUGASSERT(entry->users < 100000); /* detect weird values */
      /* a new transfer using this socket */
      entry->users++;
      if(cur_action & CURL_POLL_IN)
        entry->readers++;
      if(cur_action & CURL_POLL_OUT)
        entry->writers++;
      /* add 'data' to the transfer hash on this socket! */
      if(!Curl_hash_add(&entry->transfers, (char *)&data, /* hash key */
                        sizeof(struct Curl_easy *), data)) {
        Curl_hash_destroy(&entry->transfers);
        return CURLM_OUT_OF_MEMORY;
      }
    }

    comboaction = (entry->writers ? CURL_POLL_OUT : 0) |
                   (entry->readers ? CURL_POLL_IN : 0);

    /* socket existed before and has the same action set as before */
    if(last_action && ((int)entry->action == comboaction))
      /* same, continue */
      continue;

    if(multi->socket_cb) {
      set_in_callback(multi, TRUE);
      rc = multi->socket_cb(data, s, comboaction, multi->socket_userp,
                            entry->socketp);

      set_in_callback(multi, FALSE);
      if(rc == -1) {
        multi->dead = TRUE;
        return CURLM_ABORTED_BY_CALLBACK;
      }
    }

    /* store the current action state */
    entry->action = (unsigned int)comboaction;
  }

  /* Check for last_poll.sockets that no longer appear in ps->sockets.
   * Need to remove the easy handle from the multi->sockhash->transfers and
   * remove multi->sockhash entry when this was the last transfer */
  for(i = 0; i < last_ps->num; i++) {
    unsigned int j;
    bool stillused = FALSE;
    s = last_ps->sockets[i];
    for(j = 0; j < ps->num; j++) {
      if(s == ps->sockets[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      unsigned char oldactions = last_ps->actions[i];
      /* this socket has been removed. Decrease user count */
      DEBUGASSERT(entry->users);
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        bool dead = FALSE;
        if(multi->socket_cb) {
          set_in_callback(multi, TRUE);
          rc = multi->socket_cb(data, s, CURL_POLL_REMOVE,
                                multi->socket_userp, entry->socketp);
          set_in_callback(multi, FALSE);
          if(rc == -1)
            dead = TRUE;
        }
        sh_delentry(entry, &multi->sockhash, s);
        if(dead) {
          multi->dead = TRUE;
          return CURLM_ABORTED_BY_CALLBACK;
        }
      }
      else {
        /* still users, but remove this handle as a user of this socket */
        if(Curl_hash_delete(&entry->transfers, (char *)&data,
                            sizeof(struct Curl_easy *))) {
          DEBUGASSERT(NULL);
        }
      }
    }
  } /* for loop over num */

  return CURLM_OK;
}